

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::UniversalPrint<phmap::priv::(anonymous_namespace)::StringTable>
               (StringTable *value,ostream *os)

{
  char cVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar9 [11];
  undefined1 auVar10 [12];
  undefined1 auVar11 [13];
  undefined1 auVar12 [14];
  bool bVar13;
  char *pcVar14;
  uint uVar15;
  char *pcVar16;
  long lVar17;
  value_type *elem;
  anon_union_8_1_a8a14541_for_iterator_1 aVar18;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  iterator iVar19;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_33,1);
  iVar19 = phmap::priv::
           raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
           ::begin(&value->
                    super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                  );
  pcVar16 = (value->
            super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
            ).ctrl_ + (value->
                      super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                      ).capacity_;
  if (iVar19.ctrl_ != pcVar16) {
    lVar17 = 0;
    do {
      if ((lVar17 == 0) ||
         (std::__ostream_insert<char,std::char_traits<char>>(os,&local_35,1), lVar17 != 0x20)) {
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_34,1);
        PrintTo<std::__cxx11::string,std::__cxx11::string>(&(iVar19.field_1.slot_)->pair,os);
        lVar17 = lVar17 + 1;
        bVar13 = true;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        lVar17 = 0x20;
        bVar13 = false;
      }
      if (!bVar13) break;
      aVar18.slot_ = iVar19.field_1.slot_ + 1;
      cVar1 = iVar19.ctrl_[1];
      pcVar14 = iVar19.ctrl_ + 1;
      while (cVar1 < -1) {
        iVar5 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                       CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
        iVar6 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                       CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
        iVar7 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                       CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
        iVar8 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                       CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
        in_XMM1_Ba = -(*pcVar14 < (char)iVar5);
        in_XMM1_Bb = -(pcVar14[1] < (char)((uint)iVar5 >> 8));
        in_XMM1_Bc = -(pcVar14[2] < (char)((uint)iVar5 >> 0x10));
        in_XMM1_Bd = -(pcVar14[3] < (char)((uint)iVar5 >> 0x18));
        in_XMM1_Be = -(pcVar14[4] < (char)iVar6);
        in_XMM1_Bf = -(pcVar14[5] < (char)((uint)iVar6 >> 8));
        in_XMM1_Bg = -(pcVar14[6] < (char)((uint)iVar6 >> 0x10));
        in_XMM1_Bh = -(pcVar14[7] < (char)((uint)iVar6 >> 0x18));
        in_XMM1_Bi = -(pcVar14[8] < (char)iVar7);
        in_XMM1_Bj = -(pcVar14[9] < (char)((uint)iVar7 >> 8));
        in_XMM1_Bk = -(pcVar14[10] < (char)((uint)iVar7 >> 0x10));
        in_XMM1_Bl = -(pcVar14[0xb] < (char)((uint)iVar7 >> 0x18));
        in_XMM1_Bm = -(pcVar14[0xc] < (char)iVar8);
        in_XMM1_Bn = -(pcVar14[0xd] < (char)((uint)iVar8 >> 8));
        in_XMM1_Bo = -(pcVar14[0xe] < (char)((uint)iVar8 >> 0x10));
        in_XMM1_Bp = -(pcVar14[0xf] < (char)((uint)iVar8 >> 0x18));
        auVar3[1] = in_XMM1_Bb;
        auVar3[0] = in_XMM1_Ba;
        auVar3[2] = in_XMM1_Bc;
        auVar3[3] = in_XMM1_Bd;
        auVar3[4] = in_XMM1_Be;
        auVar3[5] = in_XMM1_Bf;
        auVar3[6] = in_XMM1_Bg;
        auVar3[7] = in_XMM1_Bh;
        auVar3[8] = in_XMM1_Bi;
        auVar3[9] = in_XMM1_Bj;
        auVar3[10] = in_XMM1_Bk;
        auVar3[0xb] = in_XMM1_Bl;
        auVar3[0xc] = in_XMM1_Bm;
        auVar3[0xd] = in_XMM1_Bn;
        auVar3[0xe] = in_XMM1_Bo;
        auVar3[0xf] = in_XMM1_Bp;
        auVar4[1] = in_XMM1_Bb;
        auVar4[0] = in_XMM1_Ba;
        auVar4[2] = in_XMM1_Bc;
        auVar4[3] = in_XMM1_Bd;
        auVar4[4] = in_XMM1_Be;
        auVar4[5] = in_XMM1_Bf;
        auVar4[6] = in_XMM1_Bg;
        auVar4[7] = in_XMM1_Bh;
        auVar4[8] = in_XMM1_Bi;
        auVar4[9] = in_XMM1_Bj;
        auVar4[10] = in_XMM1_Bk;
        auVar4[0xb] = in_XMM1_Bl;
        auVar4[0xc] = in_XMM1_Bm;
        auVar4[0xd] = in_XMM1_Bn;
        auVar4[0xe] = in_XMM1_Bo;
        auVar4[0xf] = in_XMM1_Bp;
        auVar12[1] = in_XMM1_Bd;
        auVar12[0] = in_XMM1_Bc;
        auVar12[2] = in_XMM1_Be;
        auVar12[3] = in_XMM1_Bf;
        auVar12[4] = in_XMM1_Bg;
        auVar12[5] = in_XMM1_Bh;
        auVar12[6] = in_XMM1_Bi;
        auVar12[7] = in_XMM1_Bj;
        auVar12[8] = in_XMM1_Bk;
        auVar12[9] = in_XMM1_Bl;
        auVar12[10] = in_XMM1_Bm;
        auVar12[0xb] = in_XMM1_Bn;
        auVar12[0xc] = in_XMM1_Bo;
        auVar12[0xd] = in_XMM1_Bp;
        auVar11[1] = in_XMM1_Be;
        auVar11[0] = in_XMM1_Bd;
        auVar11[2] = in_XMM1_Bf;
        auVar11[3] = in_XMM1_Bg;
        auVar11[4] = in_XMM1_Bh;
        auVar11[5] = in_XMM1_Bi;
        auVar11[6] = in_XMM1_Bj;
        auVar11[7] = in_XMM1_Bk;
        auVar11[8] = in_XMM1_Bl;
        auVar11[9] = in_XMM1_Bm;
        auVar11[10] = in_XMM1_Bn;
        auVar11[0xb] = in_XMM1_Bo;
        auVar11[0xc] = in_XMM1_Bp;
        auVar10[1] = in_XMM1_Bf;
        auVar10[0] = in_XMM1_Be;
        auVar10[2] = in_XMM1_Bg;
        auVar10[3] = in_XMM1_Bh;
        auVar10[4] = in_XMM1_Bi;
        auVar10[5] = in_XMM1_Bj;
        auVar10[6] = in_XMM1_Bk;
        auVar10[7] = in_XMM1_Bl;
        auVar10[8] = in_XMM1_Bm;
        auVar10[9] = in_XMM1_Bn;
        auVar10[10] = in_XMM1_Bo;
        auVar10[0xb] = in_XMM1_Bp;
        auVar9[1] = in_XMM1_Bg;
        auVar9[0] = in_XMM1_Bf;
        auVar9[2] = in_XMM1_Bh;
        auVar9[3] = in_XMM1_Bi;
        auVar9[4] = in_XMM1_Bj;
        auVar9[5] = in_XMM1_Bk;
        auVar9[6] = in_XMM1_Bl;
        auVar9[7] = in_XMM1_Bm;
        auVar9[8] = in_XMM1_Bn;
        auVar9[9] = in_XMM1_Bo;
        auVar9[10] = in_XMM1_Bp;
        uVar15 = (ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB141(auVar12 >> 7,0) & 1) << 2 |
                          (ushort)(SUB131(auVar11 >> 7,0) & 1) << 3 |
                          (ushort)(SUB121(auVar10 >> 7,0) & 1) << 4 |
                          (ushort)(SUB111(auVar9 >> 7,0) & 1) << 5 |
                          (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                   CONCAT18(in_XMM1_Bo,
                                                            CONCAT17(in_XMM1_Bn,
                                                                     CONCAT16(in_XMM1_Bm,
                                                                              CONCAT15(in_XMM1_Bl,
                                                                                       CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                          (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                   CONCAT17(in_XMM1_Bo,
                                                            CONCAT16(in_XMM1_Bn,
                                                                     CONCAT15(in_XMM1_Bm,
                                                                              CONCAT14(in_XMM1_Bl,
                                                                                       CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                         7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
        uVar2 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        aVar18.slot_ = (slot_type *)
                       ((long)&((aVar18.slot_)->pair).first._M_dataplus._M_p + (ulong)(uVar2 << 6));
        cVar1 = pcVar14[uVar2];
        pcVar14 = pcVar14 + uVar2;
      }
      iVar19.field_1.slot_ = aVar18.slot_;
      iVar19.ctrl_ = pcVar14;
    } while (pcVar14 != pcVar16);
    if (lVar17 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_32,1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
  return;
}

Assistant:

void UniversalPrint(const T& value, ::std::ostream* os) {
  // A workarond for the bug in VC++ 7.1 that prevents us from instantiating
  // UniversalPrinter with T directly.
  typedef T T1;
  UniversalPrinter<T1>::Print(value, os);
}